

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O1

void __thiscall Loop_Infinite_Test::~Loop_Infinite_Test(Loop_Infinite_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Loop, Infinite) {
	MockParser mock(
		"let a = 3\n"
		"loop {\n"
		"  let b = 4\n"
		"}\n"
	);

	INS2(BC_SET_N, 0, 0);
	INS2(BC_SET_N, 1, 1);
	LOOP(-1);
	INS(BC_RET, 0, 0, 0);
}